

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

void __thiscall
helics::ValueFederateManager::updateTime(ValueFederateManager *this,Time newTime,Time param_2)

{
  void *pvVar1;
  Input *pIVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Input **ppIVar5;
  pointer pIVar6;
  handle inpHandle;
  InterfaceHandle handle;
  BlockIterator<helics::Input,_32,_helics::Input_**> fid;
  vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> handles;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> allCall;
  handle local_c0;
  handle local_a8;
  InterfaceHandle local_8c;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *local_88;
  BlockIterator<helics::Input,_32,_helics::Input_**> local_80;
  vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> local_68;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  (this->CurrentTime).internalTimeCode = newTime.internalTimeCode;
  iVar4 = (*this->coreObject->_vptr_Core[0x34])(this->coreObject,(ulong)(uint)(this->fedID).fid);
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::vector
            (&local_68,
             (vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)
             CONCAT44(extraout_var,iVar4));
  if (local_68.super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_88 = &this->inputs;
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock(&local_c0,local_88);
    gmlc::libguarded::
    atomic_guarded<std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
    ::load((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *)&local_50,
           &this->allCallback);
    if (local_68.
        super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pIVar6 = local_68.
               super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_8c.hid = pIVar6->hid;
        gmlc::containers::
        DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::
        find(&local_80,local_c0.data,&local_8c);
        iVar4 = ((local_c0.data)->dataStorage).bsize;
        ppIVar5 = ((local_c0.data)->dataStorage).dataptr;
        if (iVar4 == 0x20) {
          if (ppIVar5 == (Input **)0x0) {
            ppIVar5 = (Input **)
                      &gmlc::containers::
                       StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                       emptyValue;
          }
          else {
            ppIVar5 = ppIVar5 + (long)((local_c0.data)->dataStorage).dataSlotIndex + 1;
          }
          iVar4 = 0;
        }
        else {
          ppIVar5 = ppIVar5 + ((local_c0.data)->dataStorage).dataSlotIndex;
        }
        if (((ppIVar5 != local_80.vec) &&
            (((local_80.vec == (Input **)0x0 || (*local_80.vec != (Input *)0x0)) ||
             (*ppIVar5 != (Input *)0x0)))) || (iVar4 != local_80.offset)) {
          pvVar1 = (local_80.ptr)->dataReference;
          *(baseType *)((long)pvVar1 + 0x28) = (this->CurrentTime).internalTimeCode;
          bVar3 = getUpdateFromCore(this,local_80.ptr);
          pIVar2 = local_80.ptr;
          if (bVar3) {
            if (*(long *)((long)pvVar1 + 0xd0) == 0) {
              if (local_40 == (code *)0x0) goto LAB_001f19ca;
              local_c0.data = (pointer)0x0;
              if (local_c0.m_handle_lock._M_owns == false) {
                local_a8.data = (pointer)(this->CurrentTime).internalTimeCode;
              }
              else {
                std::unique_lock<std::mutex>::unlock(&local_c0.m_handle_lock);
                local_a8.data = (pointer)(this->CurrentTime).internalTimeCode;
                if (local_40 == (code *)0x0) {
                  std::__throw_bad_function_call();
                }
              }
              (*local_38)(&local_50,pIVar2,(TimeRepresentation<count_time<9,_long>_> *)&local_a8);
              gmlc::libguarded::
              shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::lock(&local_a8,local_88);
            }
            else {
              local_c0.data = (pointer)0x0;
              if (local_c0.m_handle_lock._M_owns == false) {
                local_a8.data = (pointer)(this->CurrentTime).internalTimeCode;
              }
              else {
                std::unique_lock<std::mutex>::unlock(&local_c0.m_handle_lock);
                local_a8.data = (pointer)(this->CurrentTime).internalTimeCode;
                if (*(long *)((long)pvVar1 + 0xd0) == 0) {
                  std::__throw_bad_function_call();
                }
              }
              (**(code **)((long)pvVar1 + 0xd8))((long)pvVar1 + 0xc0,pIVar2,&local_a8);
              gmlc::libguarded::
              shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::lock(&local_a8,local_88);
            }
            local_c0.data = local_a8.data;
            std::unique_lock<std::mutex>::operator=(&local_c0.m_handle_lock,&local_a8.m_handle_lock)
            ;
            std::unique_lock<std::mutex>::~unique_lock(&local_a8.m_handle_lock);
          }
        }
LAB_001f19ca:
        pIVar6 = pIVar6 + 1;
      } while (pIVar6 != local_68.
                         super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_c0.m_handle_lock);
  }
  if (local_68.super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ValueFederateManager::updateTime(Time newTime, Time /*oldTime*/)
{
    CurrentTime = newTime;
    auto handles = coreObject->getValueUpdates(fedID);
    if (handles.empty()) {
        return;
    }
    // lock the data updates
    auto inpHandle = inputs.lock();
    auto allCall = allCallback.load();
    for (auto handle : handles) {
        /** find the id*/
        auto fid = inpHandle->find(handle);
        if (fid != inpHandle->end()) {  // assign the data
            auto* iData = static_cast<InputData*>(fid->dataReference);
            iData->lastUpdate = CurrentTime;

            bool updated = getUpdateFromCore(*fid);

            if (updated) {
                if (iData->callback) {
                    Input& inp = *fid;

                    inpHandle.unlock();  // need to free the lock

                    // callbacks can do all sorts of things, best not to have it locked during the
                    // callback
                    iData->callback(inp, CurrentTime);
                    inpHandle = inputs.lock();
                } else if (allCall) {
                    Input& inp = *fid;
                    inpHandle.unlock();  // need to free the lock
                    // callbacks can do all sorts of strange things, best not to have it locked
                    // during the callback
                    allCall(inp, CurrentTime);
                    inpHandle = inputs.lock();
                }
            }
        }
    }
}